

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsOn(cmMakefile *this,string *name)

{
  bool bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  string_view value;
  
  cVar2 = GetDefinition(this,name);
  if (cVar2.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmMakefile::IsOn(const std::string& name) const
{
  return this->GetDefinition(name).IsOn();
}